

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O0

int to_pkcs8(char *in_path,char *out_path,char *file_pin)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  uint *puVar6;
  char *in_RSI;
  char *in_RDI;
  bool bVar7;
  int fd;
  key_material_t pkey [18];
  uint32_t bitfield;
  int data_length;
  int algorithm;
  int found;
  int error;
  int n;
  int m;
  int lineno;
  char *value_pointer;
  char data [4096];
  char line [4096];
  FILE *file_pointer;
  key_material_t *in_stack_ffffffffffffde30;
  FILE *__stream;
  uchar *targsize;
  uchar *in_stack_ffffffffffffde50;
  char *in_stack_ffffffffffffde58;
  key_material_t *local_2188;
  key_material_t local_2178;
  key_material_t *in_stack_ffffffffffffde98;
  char *in_stack_ffffffffffffdea0;
  key_material_t *in_stack_ffffffffffffdea8;
  char *in_stack_ffffffffffffdeb0;
  char *in_stack_ffffffffffffdeb8;
  key_material_t kStack_2058;
  uint local_2048;
  uint local_2044;
  int local_2040;
  uint local_203c;
  uint local_2038;
  uint local_2034;
  uchar *local_2030;
  undefined1 local_2028 [4096];
  uchar local_1028 [4096];
  FILE *local_28;
  char *local_18;
  char *local_10;
  int local_4;
  
  local_28 = (FILE *)0x0;
  local_2030 = (uchar *)0x0;
  local_2034 = 0;
  local_2040 = 0;
  local_2048 = 0xffffffff;
  kStack_2058.big._0_4_ = 0;
  local_2188 = &local_2178;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    key_material_t::key_material_t(local_2188);
    local_2188 = local_2188 + 1;
  } while (local_2188 != &kStack_2058);
  if (local_10 == (char *)0x0) {
    fprintf(_stderr,"ERROR: A path to the input file must be supplied. Use --in <path>\n");
    local_4 = 1;
  }
  else if (local_18 == (char *)0x0) {
    fprintf(_stderr,"ERROR: A path to the output file must be supplied. Use --out <path>\n");
    local_4 = 1;
  }
  else {
    local_28 = fopen(local_10,"r");
    if (local_28 == (FILE *)0x0) {
      fprintf(_stderr,"ERROR: Could not open input file %.100s for reading.\n",local_10);
      local_4 = 1;
    }
    else {
      while (pcVar2 = fgets((char *)local_1028,0x1000,local_28), pcVar2 != (char *)0x0) {
        local_2034 = local_2034 + 1;
        local_2038 = 0;
        local_2044 = 0xffffffff;
        while( true ) {
          bVar7 = false;
          if (local_2044 == 0xffffffff) {
            bVar7 = file_tags[(int)local_2038] != (char *)0x0;
          }
          if (!bVar7) break;
          in_stack_ffffffffffffde50 = local_1028;
          in_stack_ffffffffffffde58 = file_tags[(int)local_2038];
          sVar3 = strlen(file_tags[(int)local_2038]);
          iVar1 = strncasecmp((char *)in_stack_ffffffffffffde50,in_stack_ffffffffffffde58,sVar3);
          if (iVar1 == 0) {
            local_2044 = local_2038;
          }
          local_2038 = local_2038 + 1;
        }
        if (local_2044 == 0xffffffff) {
          fprintf(_stderr,"ERROR: Unrecognized input line %i\n",(ulong)local_2034);
          fprintf(_stderr,"ERROR: --> %s",local_1028);
        }
        else {
          targsize = local_1028;
          sVar3 = strlen(file_tags[(int)local_2044]);
          local_2030 = targsize + sVar3 + 1;
          if (*local_2030 != '\0') {
            if (((uint)kStack_2058.big & 1 << ((byte)local_2044 & 0x1f)) == 0) {
              kStack_2058.big._0_4_ = (uint)kStack_2058.big | 1 << (local_2044 & 0x1f);
              switch(local_2044) {
              case 0:
                iVar1 = __isoc99_sscanf(local_2030,"v%i.%i",&local_2038,&local_203c);
                if (iVar1 == 2) {
                  if ((1 < (int)local_2038) || ((local_2038 == 1 && (3 < (int)local_203c)))) {
                    fprintf(_stderr,"ERROR: Cannot parse this version of file format, v%i.%i.\n",
                            (ulong)local_2038,(ulong)local_203c);
                    local_2040 = 1;
                  }
                }
                else {
                  fprintf(_stderr,"ERROR: Invalid/unknown version string (%.100s).\n",local_2030);
                  local_2040 = 1;
                }
                break;
              case 1:
                lVar4 = strtol((char *)local_2030,(char **)0x0,10);
                local_2048 = (uint)lVar4;
                break;
              case 2:
              case 3:
              case 4:
              case 5:
              case 6:
              case 7:
              case 8:
              case 9:
              case 10:
              case 0xb:
              case 0xc:
              case 0xd:
              case 0xe:
                kStack_2058.big._4_4_ =
                     b64_pton(in_stack_ffffffffffffde58,in_stack_ffffffffffffde50,(size_t)targsize);
                if (kStack_2058.big._4_4_ == -1) {
                  local_2040 = 1;
                  fprintf(_stderr,"ERROR: Could not parse the base64 string on line %i.\n",
                          (ulong)local_2034);
                }
                else {
                  pvVar5 = malloc((long)kStack_2058.big._4_4_);
                  (&local_2178)[(int)local_2044].big = pvVar5;
                  if ((&local_2178)[(int)local_2044].big == (void *)0x0) {
                    fprintf(_stderr,"ERROR: Could not allocate memory.\n");
                    local_2040 = 1;
                  }
                  else {
                    memcpy((&local_2178)[(int)local_2044].big,local_2028,(long)kStack_2058.big._4_4_
                          );
                    (&local_2178)[(int)local_2044].size = (long)kStack_2058.big._4_4_;
                  }
                }
                break;
              case 0xf:
              case 0x10:
              case 0x11:
              }
            }
            else {
              fprintf(_stderr,"ERROR: Duplicate \"%s\" field, line %i - ignored\n",
                      file_tags[(int)local_2044],(ulong)local_2034);
            }
          }
        }
      }
      fclose(local_28);
      if (local_2040 == 0) {
        iVar1 = open(local_18,0x40,0x180);
        if (iVar1 == -1) {
          __stream = _stderr;
          puVar6 = (uint *)__errno_location();
          fprintf(__stream,"ERROR: Could not open the output file: %s (errno %i)\n",local_18,
                  (ulong)*puVar6);
          free_key_material((key_material_t *)__stream);
          local_4 = 1;
        }
        else {
          close(iVar1);
          crypto_init();
          switch(local_2048) {
          case 1:
          case 5:
          case 7:
          case 8:
          case 10:
            local_2040 = save_rsa_pkcs8(in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0,
                                        in_stack_ffffffffffffdea8);
            break;
          case 3:
          case 6:
            local_2040 = save_dsa_pkcs8((char *)in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0,
                                        in_stack_ffffffffffffde98);
            break;
          case 4:
          case 0xc:
          default:
            fprintf(_stderr,"ERROR: The algorithm %i is not supported.\n",(ulong)local_2048);
            local_2040 = 1;
            break;
          case 0xffffffff:
            fprintf(_stderr,"ERROR: The algorithm %i was not given in the file.\n",(ulong)local_2048
                   );
            local_2040 = 1;
          }
          crypto_final();
          free_key_material(in_stack_ffffffffffffde30);
          local_4 = local_2040;
        }
      }
      else {
        free_key_material(in_stack_ffffffffffffde30);
        local_4 = local_2040;
      }
    }
  }
  return local_4;
}

Assistant:

int to_pkcs8(char* in_path, char* out_path, char* file_pin)
{
	FILE* file_pointer = NULL;
	char line[MAX_LINE], data[MAX_LINE];
	char* value_pointer = NULL;
	int lineno = 0, m, n, error = 0, found, algorithm = DNS_KEYALG_ERROR, data_length;
	uint32_t bitfield = 0;
	key_material_t pkey[TAG_MAX];

	if (in_path == NULL)
	{
		fprintf(stderr, "ERROR: A path to the input file must be supplied. Use --in <path>\n");
		return 1;
	}

	if (out_path == NULL)
	{
		fprintf(stderr, "ERROR: A path to the output file must be supplied. Use --out <path>\n");
		return 1;
	}

	file_pointer = fopen(in_path, "r");
	if (file_pointer == NULL)
	{
		fprintf(stderr, "ERROR: Could not open input file %.100s for reading.\n", in_path);
		return 1;
	}

	// Loop over all of the lines
	while (fgets(line, MAX_LINE, file_pointer) != NULL)
	{
		lineno++;

		// Find the current text field in the BIND file.
		for (m = 0, found = -1; found == -1 && file_tags[m]; m++)
		{
			if (strncasecmp(line, file_tags[m], strlen(file_tags[m])) == 0)
			{
				found = m;
			}
		}

		// The text files is not recognized.
		if (found == -1)
		{
			fprintf(stderr, "ERROR: Unrecognized input line %i\n", lineno);
			fprintf(stderr, "ERROR: --> %s", line);
			continue;
		}

		// Point to the data for this text field.
		value_pointer = line + strlen(file_tags[found]) + 1;

		// Continue if we are at the end of the string
		if (*value_pointer == 0)
		{
			continue;
		}

		// Check that we do not get duplicates.
		if (bitfield & (1 << found))
		{
			fprintf(stderr, "ERROR: Duplicate \"%s\" field, line %i - ignored\n",
					file_tags[found], lineno);
			continue;
		}
		bitfield |= (1 << found);

		// Handle the data for this text field.
		switch (found)
		{
			case TAG_VERSION:
				if (sscanf(value_pointer, "v%i.%i", &m, &n) != 2)
				{
					fprintf(stderr, "ERROR: Invalid/unknown version string "
							"(%.100s).\n", value_pointer);
					error = 1;
					break;
				}
				if (m > FILE_MAJOR_VERSION || (m == FILE_MAJOR_VERSION && n > FILE_MINOR_VERSION))
				{
					fprintf(stderr, "ERROR: Cannot parse this version of file format, "
							"v%i.%i.\n", m, n);
					error = 1;
				}
				break;
			case TAG_ALGORITHM:
				algorithm = strtol(value_pointer, NULL, 10);
				break;
			// RSA
			case TAG_MODULUS:
			case TAG_PUBEXP:
			case TAG_PRIVEXP:
			case TAG_PRIME1:
			case TAG_PRIME2:
			case TAG_EXP1:
			case TAG_EXP2:
			case TAG_COEFF:
			// DSA
			case TAG_PRIME:
			case TAG_SUBPRIME:
			case TAG_BASE:
			case TAG_PRIVVAL:
			case TAG_PUBVAL:
				data_length = b64_pton(value_pointer, (unsigned char*)data, MAX_LINE);
				if (data_length == -1)
				{
					error = 1;
					fprintf(stderr, "ERROR: Could not parse the base64 string on line %i.\n", lineno);
				}
				else
				{
					pkey[found].big = malloc(data_length);
					if (!pkey[found].big)
					{
						fprintf(stderr, "ERROR: Could not allocate memory.\n");
						error = 1;
						break;
					}
					memcpy(pkey[found].big, data, data_length);
					pkey[found].size = data_length;
				}
				break;
			// Do not need these
			case TAG_CREATED:
			case TAG_PUBLISH:
			case TAG_ACTIVATE:
			default:
				break;
		}
	}

	fclose(file_pointer);

	// Something went wrong. Clean up and quit.
	if (error)
	{
		free_key_material(pkey);
		return error;
	}

	// Create and set file permissions if the file does not exist.
	int fd = open(out_path, O_CREAT, S_IRUSR | S_IWUSR);
	if (fd == -1)
	{
		fprintf(stderr, "ERROR: Could not open the output file: %s (errno %i)\n",
			out_path, errno);
		free_key_material(pkey);
		return 1;
	}
	::close(fd);

	crypto_init();

	// Save the the key to the disk
	switch (algorithm)
	{
		case DNS_KEYALG_ERROR:
			fprintf(stderr, "ERROR: The algorithm %i was not given in the file.\n",
					algorithm);
			error = 1;
			break;
		case DNS_KEYALG_RSAMD5:
		case DNS_KEYALG_RSASHA1:
		case DNS_KEYALG_RSASHA1_NSEC3_SHA1:
		case DNS_KEYALG_RSASHA256:
		case DNS_KEYALG_RSASHA512:
			error = save_rsa_pkcs8(out_path, file_pin, pkey);
			break;
		case DNS_KEYALG_DSA:
		case DNS_KEYALG_DSA_NSEC3_SHA1:
			error = save_dsa_pkcs8(out_path, file_pin, pkey);
			break;
		case DNS_KEYALG_ECC:
		case DNS_KEYALG_ECC_GOST:
		default:
			fprintf(stderr, "ERROR: The algorithm %i is not supported.\n",
					algorithm);
			error = 1;
			break;
	}

	crypto_final();
	free_key_material(pkey);

	return error;
}